

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O2

float __thiscall crnlib::vec<3U,_float>::squared_distance(vec<3U,_float> *this,vec<3U,_float> *rhs)

{
  uint i;
  long lVar1;
  float dist2;
  float fVar2;
  
  dist2 = 0.0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    fVar2 = this->m_s[lVar1] - rhs->m_s[lVar1];
    dist2 = dist2 + fVar2 * fVar2;
  }
  return dist2;
}

Assistant:

inline T squared_distance(const vec& rhs) const
        {
            T dist2 = 0;
            for (uint i = 0; i < N; i++)
            {
                T d = m_s[i] - rhs.m_s[i];
                dist2 += d * d;
            }
            return dist2;
        }